

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib543.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uchar a [20];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  
  local_28 = 0x3d4b269c;
  uStack_24 = 0x1a10449;
  uStack_20 = 0x207cd8e0;
  uStack_1c = 0x2953efb7;
  local_18 = 0xe1571dfa;
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    iVar1 = 0x7e;
  }
  else {
    lVar3 = curl_easy_escape(lVar2,&local_28,0x14);
    if (lVar3 != 0) {
      curl_mprintf("%s\n",lVar3);
      curl_free(lVar3);
    }
    curl_easy_cleanup(lVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  unsigned char a[] = {0x9c, 0x26, 0x4b, 0x3d, 0x49, 0x4, 0xa1, 0x1,
                       0xe0, 0xd8, 0x7c,  0x20, 0xb7, 0xef, 0x53, 0x29, 0xfa,
                       0x1d, 0x57, 0xe1};

  CURL *easy;
  int asize;
  char *s;
  (void)URL;

  easy = curl_easy_init();
  if(!easy) {
    fprintf(stderr, "curl_easy_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  asize = (int)sizeof(a);

  s = curl_easy_escape(easy, (char *)a, asize);

  if(s)
    printf("%s\n", s);

  if(s)
    curl_free(s);

  curl_easy_cleanup(easy);

  return 0;
}